

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_error.c
# Opt level: O3

void dwarf_error_creation(Dwarf_Debug dbg,Dwarf_Error *err,char *errmsg)

{
  char *msg;
  dwarfstring m;
  dwarfstring_s local_40;
  
  if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
    dwarfstring_constructor(&local_40);
    dwarfstring_append(&local_40,"DW_DLE_USER_DECLARED_ERROR: ");
    dwarfstring_append(&local_40,errmsg);
    msg = dwarfstring_string(&local_40);
    _dwarf_error_string(dbg,err,0x1d3,msg);
    dwarfstring_destructor(&local_40);
  }
  return;
}

Assistant:

void
dwarf_error_creation(Dwarf_Debug dbg,
    Dwarf_Error *err,
    char *errmsg)
{
    dwarfstring m;

    if (IS_INVALID_DBG(dbg)) {
        return;
    }
    dwarfstring_constructor(&m);
    dwarfstring_append(&m,"DW_DLE_USER_DECLARED_ERROR: ");
    dwarfstring_append(&m,errmsg);
    _dwarf_error_string(dbg,err,
        DW_DLE_USER_DECLARED_ERROR,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}